

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

void MEM_writeLE16(void *memPtr,U16 val)

{
  uint uVar1;
  BYTE *p;
  U16 val_local;
  void *memPtr_local;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    *(U16 *)memPtr = val;
  }
  else {
    MEM_write16(memPtr,val);
  }
  return;
}

Assistant:

MEM_STATIC void MEM_writeLE16(void* memPtr, U16 val)
{
    if (MEM_isLittleEndian()) {
        MEM_write16(memPtr, val);
    } else {
        BYTE* p = (BYTE*)memPtr;
        p[0] = (BYTE)val;
        p[1] = (BYTE)(val>>8);
    }
}